

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O2

door_t * get_door(doorindex_t index)

{
  return doors + (ulong)(index & 0x7f) * 2 + (ulong)(index >> 7);
}

Assistant:

const door_t *get_door(doorindex_t index)
{
  const door_t *door; /* was HL */

  assert((index & ~door_REVERSE) < door_MAX);

  /* Conv: Mask before multiplication to avoid overflow. */
  door = &doors[(index & ~door_REVERSE) * 2];
  if (index & door_REVERSE)
    door++;

  return door;
}